

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_set_handler.c
# Opt level: O2

sig_handler_t * sig_set_handler(int signo,sig_handler_t *handler)

{
  int iVar1;
  sigaction old_act;
  sigaction act;
  
  act.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)handler;
  sigemptyset((sigset_t *)&act.sa_mask);
  act.sa_flags = 0;
  iVar1 = sigaction(signo,(sigaction *)&act,(sigaction *)&old_act);
  if (iVar1 < 0) {
    perror("sigaction");
    old_act.__sigaction_handler =
         (anon_union_8_2_5ad2d23e_for___sigaction_handler)0xffffffffffffffff;
  }
  return old_act.__sigaction_handler.sa_handler;
}

Assistant:

sig_handler_t *sig_set_handler(int signo, sig_handler_t *handler) {
  struct sigaction act, old_act;

  act.sa_handler = handler;
  sigemptyset(&act.sa_mask);
  act.sa_flags = 0;

  if (sigaction(signo, &act, &old_act) < 0) {
    perror("sigaction");
    return SIG_ERR;
  }

  return old_act.sa_handler;
}